

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar_pidd.hpp
# Opt level: O3

vector<Tiles::State,_std::allocator<Tiles::State>_> * __thiscall
astar_pidd::AStarPIDD<Tiles>::search
          (vector<Tiles::State,_std::allocator<Tiles::State>_> *__return_storage_ptr__,
          AStarPIDD<Tiles> *this,State *init)

{
  size_t *psVar1;
  pointer *ppSVar2;
  undefined8 *puVar3;
  char cVar4;
  int iVar5;
  iterator iVar6;
  bool bVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  CompressClosedListAsync<Node<Tiles>_> *this_00;
  int i;
  long lVar11;
  long lVar12;
  Tiles *pTVar13;
  ostream *poVar14;
  long lVar15;
  void *pvVar16;
  ulong uVar17;
  vector<Tiles::State,std::allocator<Tiles::State>> *pvVar18;
  State state;
  value_type n_1;
  Node<Tiles> n;
  Node<Tiles> parent;
  State parent_state;
  State local_d2;
  vector<Tiles::State,std::allocator<Tiles::State>> *local_c0;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *local_b8;
  CompressClosedListAsync<Node<Tiles>_> *local_b0;
  Node<Tiles> local_a8;
  Node<Tiles> local_88;
  Node<Tiles> local_70;
  ulong local_58;
  CompressOpenList<Node<Tiles>_> *local_50;
  State local_42;
  
  lVar11 = 0;
  local_88.g = '\0';
  local_88.f = init->h;
  local_88.pop = -1;
  init->tiles[init->blank] = '\0';
  local_88.parent_packed.word = 0;
  do {
    local_88.parent_packed.word = (long)init->tiles[lVar11] | local_88.parent_packed.word << 4;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x10);
  local_50 = &this->open;
  local_b8 = __return_storage_ptr__;
  local_88.packed.word = local_88.parent_packed.word;
  compress::CompressOpenList<Node<Tiles>_>::push(local_50,&local_88);
  pvVar18 = (vector<Tiles::State,std::allocator<Tiles::State>> *)&this->path;
  local_b0 = &this->closed;
  local_c0 = pvVar18;
  do {
    if (((this->open).size == 0) ||
       ((this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
                (local_b8,(vector<Tiles::State,_std::allocator<Tiles::State>_> *)pvVar18);
      return local_b8;
    }
    collect_unique_nodes((vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> *)&local_88,this,0x20);
    compress::CompressClosedListAsync<Node<Tiles>_>::batch_duplicate_detection
              (local_b0,(vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> *)&local_88);
    pvVar16 = (void *)CONCAT53(local_88._3_5_,CONCAT12(local_88.pop,CONCAT11(local_88.g,local_88.f))
                              );
    if ((void *)local_88.parent_packed.word == pvVar16) {
      bVar7 = false;
    }
    else {
      uVar17 = 0;
      do {
        local_a8.packed.word = *(uint64_t *)((long)pvVar16 + uVar17 * 0x18 + 0x10);
        puVar3 = (undefined8 *)((long)pvVar16 + uVar17 * 0x18);
        local_a8._0_8_ = *puVar3;
        local_a8.parent_packed.word = puVar3[1];
        Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&local_d2,local_a8.packed);
        cVar9 = local_d2.h;
        if (local_d2.h == '\0') {
          iVar6._M_current =
               (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_58 = uVar17;
          if (iVar6._M_current ==
              (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Tiles::State,std::allocator<Tiles::State>>::
            _M_realloc_insert<Tiles::State_const&>(local_c0,iVar6,&local_d2);
          }
          else {
            (iVar6._M_current)->blank = local_d2.blank;
            (iVar6._M_current)->h = local_d2.h;
            *(undefined8 *)(iVar6._M_current)->tiles = local_d2.tiles._0_8_;
            *(undefined8 *)((iVar6._M_current)->tiles + 8) = local_d2.tiles._8_8_;
            ppSVar2 = &(this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppSVar2 = *ppSVar2 + 1;
          }
          this_00 = local_b0;
          pvVar18 = local_c0;
          if (local_a8.packed.word != local_a8.parent_packed.word) {
            do {
              compress::CompressClosedListAsync<Node<Tiles>_>::trace_parent
                        (&local_70,this_00,&local_a8);
              Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&local_42,local_70.packed);
              iVar6._M_current =
                   (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<Tiles::State,std::allocator<Tiles::State>>::
                _M_realloc_insert<Tiles::State_const&>(pvVar18,iVar6,&local_42);
              }
              else {
                (iVar6._M_current)->blank = local_42.blank;
                (iVar6._M_current)->h = local_42.h;
                *(undefined8 *)(iVar6._M_current)->tiles = local_42.tiles._0_8_;
                *(undefined8 *)((iVar6._M_current)->tiles + 8) = local_42.tiles._8_8_;
                ppSVar2 = &(this->path).
                           super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppSVar2 = *ppSVar2 + 1;
              }
              local_a8.packed.word = local_70.packed.word;
              local_a8.g = local_70.g;
              local_a8.f = local_70.f;
              local_a8.pop = local_70.pop;
              local_a8._3_5_ = local_70._3_5_;
              local_a8.parent_packed.word = local_70.parent_packed.word;
            } while (local_70.packed.word != local_70.parent_packed.word);
          }
          compress::CompressClosedListAsync<Node<Tiles>_>::print_statistics(this_00);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
          ::clear((_Rb_tree<int,_std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
                   *)local_50);
          (this->open).size = 0;
          rmdir("open_list_buckets");
          compress::CompressClosedListAsync<Node<Tiles>_>::clear(local_b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"duplicates ",0xb);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
          std::ostream::put((char)poVar14);
          std::ostream::flush();
          std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
                    (local_b8,(vector<Tiles::State,_std::allocator<Tiles::State>_> *)local_c0);
LAB_0010f831:
          pvVar16 = (void *)CONCAT53(local_88._3_5_,
                                     CONCAT12(local_88.pop,CONCAT11(local_88.g,local_88.f)));
          uVar17 = local_58;
          if (cVar9 == '\0') {
            bVar7 = true;
            pvVar18 = local_c0;
            goto LAB_0010f87a;
          }
        }
        else {
          psVar1 = &(this->super_SearchAlg<Tiles>).expd;
          *psVar1 = *psVar1 + 1;
          pTVar13 = (this->super_SearchAlg<Tiles>).dom;
          cVar8 = local_d2.blank;
          lVar11 = (long)local_d2.blank;
          if (0 < *(int *)(pTVar13 + lVar11 * 0x14 + 0x4440)) {
            local_58 = uVar17;
            lVar15 = 0;
            do {
              iVar5 = *(int *)(pTVar13 + lVar15 * 4 + lVar11 * 0x14 + 0x4444);
              if (iVar5 != local_a8.pop) {
                psVar1 = &(this->super_SearchAlg<Tiles>).gend;
                *psVar1 = *psVar1 + 1;
                cVar10 = local_d2.h;
                cVar4 = local_d2.tiles[iVar5];
                local_d2.tiles[lVar11] = cVar4;
                local_d2.h = local_d2.h +
                             (char)pTVar13[(long)local_d2.blank * 4 +
                                           (long)cVar4 * 0x400 + (long)iVar5 * 0x40 + 0x440];
                local_d2.blank = (char)iVar5;
                local_70.g = local_a8.g + '\x01';
                local_70.f = local_a8.g + '\x01' + local_d2.h;
                local_70.pop = cVar8;
                local_d2.tiles[(char)iVar5] = '\0';
                lVar12 = 0;
                local_70.packed.word = 0;
                do {
                  local_70.packed.word = (long)local_d2.tiles[lVar12] | local_70.packed.word << 4;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 0x10);
                local_70.parent_packed.word = local_a8.packed.word;
                compress::CompressOpenList<Node<Tiles>_>::push(local_50,&local_70);
                local_d2.h = cVar10;
                local_d2.tiles[local_d2.blank] = local_d2.tiles[lVar11];
                local_d2._16_2_ = CONCAT11(local_d2.h,cVar8);
                pTVar13 = (this->super_SearchAlg<Tiles>).dom;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < *(int *)(pTVar13 + lVar11 * 0x14 + 0x4440));
            goto LAB_0010f831;
          }
          pvVar16 = (void *)CONCAT53(local_88._3_5_,
                                     CONCAT12(local_88.pop,CONCAT11(local_88.g,local_88.f)));
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < (ulong)(((long)(local_88.parent_packed.word - (long)pvVar16) >> 3) *
                               -0x5555555555555555));
      bVar7 = false;
      pvVar18 = local_c0;
    }
LAB_0010f87a:
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16);
    }
    if (bVar7) {
      return local_b8;
    }
  } while( true );
}

Assistant:

std::vector<typename Domain::State>
        search(typename Domain::State &init) {
            open.push(wrap(init, nullptr, 0, -1));

            while (!open.isempty() && path.size() == 0) {
                // temporary placeholder for intermediate reopenings
                std::vector<Node<Domain> > reopened_nodes;

                auto nodes = collect_unique_nodes(N_THREADS);
                
                closed.batch_duplicate_detection(nodes);
                               
                for (std::size_t i = 0; i < nodes.size(); ++i) {
                    auto n = nodes[i];
                    
                    typename Domain::State state;
                    this->dom.unpack(state, n.packed);

                    if (this->dom.isgoal(state)) {
                        // trace path here
                        path.push_back(state);
                        while(n.packed != n.parent_packed) {
                            Node<Domain> parent = closed.trace_parent(n);
                            typename Domain::State parent_state;
                            this->dom.unpack(parent_state, parent.packed);
                            path.push_back(parent_state);
                            n = parent;
                        }
                        closed.print_statistics();
                        open.clear();
                        closed.clear();
                        std::cout << "duplicates " << duplicates << std::endl;
                        return path;
                    }

                    this->expd++;
                    for (int i = 0; i < this->dom.nops(state); i++) {
                        int op = this->dom.nthop(state, i);
                        if (op == n.pop)
                            continue;
                        this->gend++;
                        Edge<Domain> e = this->dom.apply(state, op);
                        open.push(wrap(state, &n, e.cost, e.pop));
                        this->dom.undo(state, e);
                    }
                }
            }
            return path;
        }